

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

bool bsim::signed_gt(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  pointer pqVar4;
  pointer pqVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  iVar3 = a->N;
  uVar8 = (ulong)iVar3;
  bVar12 = (long)uVar8 < 1;
  if (0 < (long)uVar8) {
    pqVar4 = (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (1 < pqVar4->value) {
      return false;
    }
    uVar6 = 1;
    do {
      uVar10 = uVar6;
      if (uVar8 == uVar10) break;
      uVar6 = uVar10 + 1;
    } while (pqVar4[uVar10].value < 2);
    bVar12 = uVar8 <= uVar10;
  }
  if (bVar12) {
    uVar6 = (ulong)b->N;
    bVar12 = (long)uVar6 < 1;
    if (0 < (long)uVar6) {
      pqVar4 = (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (1 < pqVar4->value) {
        return false;
      }
      uVar10 = 1;
      do {
        uVar11 = uVar10;
        if (uVar6 == uVar11) break;
        uVar10 = uVar11 + 1;
      } while (pqVar4[uVar11].value < 2);
      bVar12 = uVar6 <= uVar11;
    }
    if (bVar12) {
      if (iVar3 != b->N) {
        __assert_fail("a.bitLength() == b.bitLength()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x388,
                      "bool bsim::signed_gt(const quad_value_bit_vector &, const quad_value_bit_vector &)"
                     );
      }
      pqVar4 = (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar9 = pqVar4[uVar8 - 1].value;
      bVar2 = bVar9;
      if ((bVar9 != 1) ||
         (bVar2 = (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar8 - 1].value, bVar2 != 0)) {
        if (bVar2 != 3) {
          pqVar5 = (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar1 = pqVar5[uVar8 - 1].value;
          if (uVar1 != '\x03') {
            if (uVar1 == '\x01' && bVar9 == 0) {
              return true;
            }
            bVar12 = 1 < iVar3;
            if (1 < iVar3) {
              uVar8 = (ulong)(iVar3 - 1);
              do {
                uVar7 = (int)uVar8 - 1;
                uVar8 = (ulong)uVar7;
                bVar9 = pqVar4[uVar8].value;
                if (bVar9 == 3) {
                  __assert_fail("!a.is_high_impedance()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                                ,0xde,"bool bsim::operator>(const quad_value &, const quad_value &)"
                               );
                }
                bVar2 = pqVar5[uVar8].value;
                if (bVar2 == 3) {
                  __assert_fail("!b.is_high_impedance()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                                ,0xdf,"bool bsim::operator>(const quad_value &, const quad_value &)"
                               );
                }
                if (1 < bVar9) {
                  __assert_fail("a.is_binary()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                                ,0xe1,"bool bsim::operator>(const quad_value &, const quad_value &)"
                               );
                }
                if (1 < bVar2) {
                  __assert_fail("b.is_binary()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                                ,0xe2,"bool bsim::operator>(const quad_value &, const quad_value &)"
                               );
                }
                if (bVar9 >= bVar2 && bVar9 != bVar2) {
                  bVar9 = 1;
                  break;
                }
                if (bVar9 < bVar2) {
                  bVar9 = 0;
                  break;
                }
                bVar12 = 0 < (int)uVar7;
              } while (0 < (int)uVar7);
            }
            return (bool)(bVar12 & bVar9);
          }
        }
        __assert_fail("!a.is_high_impedance()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x101,"bool bsim::operator==(const quad_value &, const quad_value &)");
      }
    }
  }
  return false;
}

Assistant:

static inline bool
  signed_gt(const quad_value_bit_vector& a,
	    const quad_value_bit_vector& b) {

    if (!a.is_binary() || !b.is_binary()) {
      return false;
    }
    
    assert(a.bitLength() == b.bitLength());

    int N = a.bitLength();

    // a negative b non-negative
    if ((a.get(N - 1) == 1) && (b.get(N - 1) == 0)) {
      return false;
    }

    // b negative a non-negative
    if ((b.get(N - 1) == 1) && (a.get(N - 1) == 0)) {
      return true;
    }

    // Both negative or both non-negative
    //if ((a.get(N - 1) == 1) && (b.get(N - 1) == 1)) {

    for (int i = N - 2; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
  	return true;
      }

      if (a.get(i) < b.get(i)) {
  	return false;
      }
    }

    return false;

  }